

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void sarimaxtest(void)

{
  int N_00;
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  FILE *__stream;
  double *inp_00;
  void *__ptr_03;
  sarimax_object obj_00;
  double temp3 [1200];
  double temp2 [1200];
  double temp [1200];
  FILE *ifp;
  int imean;
  sarimax_object obj;
  double *amse;
  double *xpred;
  double *xreg;
  double *theta;
  double *phi;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  __ptr = malloc(8);
  __ptr_00 = malloc(8);
  __ptr_01 = malloc(0);
  __ptr_02 = malloc(0);
  __stream = fopen("../data/seriesB.txt","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp2 + (long)d + 0x4af);
      d = d + 1;
    }
    inp_00 = (double *)malloc((long)d << 3);
    __ptr_03 = malloc((long)d << 4);
    for (d = 0; d < N_00; d = d + 1) {
      inp_00[d] = temp2[(long)d + 0x4af];
    }
    obj_00 = sarimax_init(1,1,1,0,0,0,0,0,1,N_00);
    sarimax_setMethod(obj_00,0);
    sarimax_exec(obj_00,inp_00,(double *)0x0);
    sarimax_summary(obj_00);
    printf("\n");
    sarimax_free(obj_00);
    free(inp_00);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    free(__ptr_03);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void sarimaxtest() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *phi, *theta;
	double *xreg;
	double *xpred, *amse;
	sarimax_object obj;
	int imean = 1;
	p = 1;
	d = 1;
	q = 1;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 0;


	L = 0;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];
	double temp3[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);
	xreg = (double*)malloc(sizeof(double)* N * 2);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//xreg[i] = temp2[i];
		//xreg[N+i] = temp3[i];
		//printf("%g \n",inp[i]);
	}


	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);
	sarimax_setMethod(obj, 0); // Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
	//sarimax_setOptMethod(obj, 5);// Method 7 ("BFGS with More Thuente Line search") is default so this step is unnecessary. The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	sarimax_exec(obj, inp,NULL);
	sarimax_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	//arima_predict(obj, inp, L, xpred, amse);
	//printf("\n");
	//printf("Predicted Values : ");
	//for (i = 0; i < L; ++i) {
	//	printf("%g ", xpred[i]);
	//}
	//printf("\n");
	//printf("Standard Errors  : ");
	//for (i = 0; i < L; ++i) {
	//	printf("%g ", sqrt(amse[i]));
	//}
	printf("\n");
	sarimax_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(xpred);
	free(amse);
	free(xreg);
}